

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_create.cpp
# Opt level: O3

optional<_khr_df_primaries_e> __thiscall
ktx::OptionsCreate::parseColorPrimaries
          (OptionsCreate *this,ParseResult *args,char *argName,Reporter *report)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_t sVar2;
  pointer pcVar3;
  char *__s;
  size_type sVar4;
  int iVar5;
  OptionValue *pOVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar7;
  long lVar8;
  const_iterator cVar9;
  ulong uVar10;
  _Optional_payload_base<_khr_df_primaries_e> _Var11;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar12;
  size_type sVar13;
  ulong uVar14;
  string prefixStr;
  string primariesStr;
  undefined1 local_2db;
  undefined1 local_2da;
  undefined1 local_2d9;
  string local_2d8;
  _khr_df_primaries_e local_2b4;
  char *local_2b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_2a8;
  size_type local_2a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_298;
  char *local_288;
  string local_280;
  _khr_df_primaries_e local_260 [10];
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_primaries_e>
  local_238;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_primaries_e>
  local_210;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_primaries_e>
  local_1e8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_primaries_e>
  local_1c0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_primaries_e>
  local_198;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_primaries_e>
  local_170;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_primaries_e>
  local_148;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_primaries_e>
  local_120;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_primaries_e>
  local_f8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_primaries_e>
  local_d0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_primaries_e>
  local_a8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_primaries_e>
  local_80;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_primaries_e>
  local_58;
  
  local_2b0 = argName;
  if ((parseColorPrimaries(cxxopts::ParseResult&,char_const*,ktx::Reporter&)::values_abi_cxx11_ ==
       '\0') &&
     (iVar5 = __cxa_guard_acquire(&parseColorPrimaries(cxxopts::ParseResult&,char_const*,ktx::Reporter&)
                                   ::values_abi_cxx11_), iVar5 != 0)) {
    local_2d8._M_dataplus._M_p = local_2d8._M_dataplus._M_p & 0xffffffff00000000;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_primaries_e>
    ::pair<const_char_(&)[5],__khr_df_primaries_e,_true>
              (&local_238,(char (*) [5])0x2103d9,(_khr_df_primaries_e *)&local_2d8);
    local_280._M_dataplus._M_p._0_4_ = 1;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_primaries_e>
    ::pair<const_char_(&)[6],__khr_df_primaries_e,_true>
              (&local_210,(char (*) [6])"BT709",(_khr_df_primaries_e *)&local_280);
    local_2b4 = KHR_DF_PRIMARIES_BT709;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_primaries_e>
    ::pair<const_char_(&)[5],__khr_df_primaries_e,_true>(&local_1e8,(char (*) [5])"SRGB",&local_2b4)
    ;
    local_260[9] = 2;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_primaries_e>
    ::pair<const_char_(&)[10],__khr_df_primaries_e,_true>
              (&local_1c0,(char (*) [10])"BT601_EBU",local_260 + 9);
    local_260[8] = 3;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_primaries_e>
    ::pair<const_char_(&)[12],__khr_df_primaries_e,_true>
              (&local_198,(char (*) [12])"BT601_SMPTE",local_260 + 8);
    local_260[7] = 4;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_primaries_e>
    ::pair<const_char_(&)[7],__khr_df_primaries_e,_true>
              (&local_170,(char (*) [7])"BT2020",local_260 + 7);
    local_260[6] = 5;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_primaries_e>
    ::pair<const_char_(&)[7],__khr_df_primaries_e,_true>
              (&local_148,(char (*) [7])"CIEXYZ",local_260 + 6);
    local_260[5] = 6;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_primaries_e>
    ::pair<const_char_(&)[5],__khr_df_primaries_e,_true>
              (&local_120,(char (*) [5])"ACES",local_260 + 5);
    local_260[4] = 7;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_primaries_e>
    ::pair<const_char_(&)[7],__khr_df_primaries_e,_true>
              (&local_f8,(char (*) [7])"ACESCC",local_260 + 4);
    local_260[3] = 8;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_primaries_e>
    ::pair<const_char_(&)[9],__khr_df_primaries_e,_true>
              (&local_d0,(char (*) [9])"NTSC1953",local_260 + 3);
    local_260[2] = 9;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_primaries_e>
    ::pair<const_char_(&)[7],__khr_df_primaries_e,_true>
              (&local_a8,(char (*) [7])"PAL525",local_260 + 2);
    local_260[1] = 10;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_primaries_e>
    ::pair<const_char_(&)[10],__khr_df_primaries_e,_true>
              (&local_80,(char (*) [10])"DISPLAYP3",local_260 + 1);
    local_260[0] = KHR_DF_PRIMARIES_ADOBERGB;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_primaries_e>
    ::pair<const_char_(&)[9],__khr_df_primaries_e,_true>
              (&local_58,(char (*) [9])"ADOBERGB",local_260);
    std::
    _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,_khr_df_primaries_e>,std::allocator<std::pair<std::__cxx11::string_const,_khr_df_primaries_e>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
    ::_Hashtable<std::pair<std::__cxx11::string_const,_khr_df_primaries_e>const*>
              ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,_khr_df_primaries_e>,std::allocator<std::pair<std::__cxx11::string_const,_khr_df_primaries_e>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                *)&parseColorPrimaries(cxxopts::ParseResult&,char_const*,ktx::Reporter&)::
                   values_abi_cxx11_,&local_238,&stack0xffffffffffffffd0,0,&local_2d9,&local_2da,
               &local_2db);
    lVar8 = -0x208;
    paVar12 = &local_58.first.field_2;
    do {
      if (paVar12 !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)(&paVar12->_M_allocated_capacity)[-2]) {
        operator_delete((long *)(&paVar12->_M_allocated_capacity)[-2],
                        paVar12->_M_allocated_capacity + 1);
      }
      paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(&paVar12->_M_allocated_capacity + -5);
      lVar8 = lVar8 + 0x28;
    } while (lVar8 != 0);
    __cxa_atexit(std::
                 unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_primaries_e,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_primaries_e>_>_>
                 ::~unordered_map,
                 &parseColorPrimaries(cxxopts::ParseResult&,char_const*,ktx::Reporter&)::
                  values_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&parseColorPrimaries(cxxopts::ParseResult&,char_const*,ktx::Reporter&)::
                         values_abi_cxx11_);
  }
  __s = local_2b0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_238,local_2b0,(allocator<char> *)&local_2d8);
  pOVar6 = cxxopts::ParseResult::operator[](args,&local_238.first);
  sVar2 = pOVar6->m_count;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238.first._M_dataplus._M_p != &local_238.first.field_2) {
    operator_delete(local_238.first._M_dataplus._M_p,
                    local_238.first.field_2._M_allocated_capacity + 1);
  }
  if (sVar2 == 0) {
    _Var11._M_payload = (_Storage<_khr_df_primaries_e,_true>)0x0;
    _Var11._M_engaged = false;
    _Var11._5_3_ = 0;
  }
  else {
    local_288 = __s;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2d8,__s,(allocator<char> *)&local_280);
    pOVar6 = cxxopts::ParseResult::operator[](args,&local_2d8);
    pbVar7 = cxxopts::OptionValue::as<std::__cxx11::string>(pOVar6);
    pcVar3 = (pbVar7->_M_dataplus)._M_p;
    local_2a8 = &local_298;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_2a8,pcVar3,pcVar3 + pbVar7->_M_string_length);
    sVar4 = local_2a0;
    paVar12 = local_2a8;
    if (local_2a0 != 0) {
      sVar13 = 0;
      do {
        iVar5 = toupper((int)paVar12->_M_local_buf[sVar13]);
        paVar12->_M_local_buf[sVar13] = (char)iVar5;
        sVar13 = sVar13 + 1;
      } while (sVar4 != sVar13);
    }
    paVar12 = &local_238.first.field_2;
    local_238.first._M_dataplus._M_p = (pointer)local_2a8;
    if (local_2a8 == &local_298) {
      local_238.first.field_2._8_8_ = local_298._8_8_;
      local_238.first._M_dataplus._M_p = (pointer)paVar12;
    }
    local_238.first.field_2._M_allocated_capacity._1_7_ = local_298._M_allocated_capacity._1_7_;
    local_238.first.field_2._M_local_buf[0] = local_298._M_local_buf[0];
    local_238.first._M_string_length = local_2a0;
    local_2a0 = 0;
    local_298._M_local_buf[0] = '\0';
    paVar1 = &local_2d8.field_2;
    local_2a8 = &local_298;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8._M_dataplus._M_p != paVar1) {
      operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
    }
    local_2d8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d8,"KHR_DF_PRIMARIES_","");
    lVar8 = std::__cxx11::string::find((char *)&local_238,(ulong)local_2d8._M_dataplus._M_p,0);
    if (lVar8 == 0) {
      if (local_238.first._M_string_length == local_2d8._M_string_length) {
        local_238.first._M_string_length = 0;
        *local_238.first._M_dataplus._M_p = '\0';
      }
      else {
        std::__cxx11::string::_M_erase((ulong)&local_238,0);
      }
    }
    cVar9 = std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_primaries_e>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_primaries_e>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find(&parseColorPrimaries(cxxopts::ParseResult&,char_const*,ktx::Reporter&)::
                    values_abi_cxx11_._M_h,&local_238.first);
    if (cVar9.
        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_primaries_e>,_true>
        ._M_cur == (__node_type *)0x0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_280,local_288,(allocator<char> *)&local_2b4);
      pOVar6 = cxxopts::ParseResult::operator[](args,&local_280);
      pbVar7 = cxxopts::OptionValue::as<std::__cxx11::string>(pOVar6);
      Reporter::fatal_usage<char_const(&)[67],char_const*&,std::__cxx11::string_const&>
                (report,(char (*) [67])
                        "Invalid or unsupported primaries specified as --{} argument: \"{}\".",
                 &local_2b0,pbVar7);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_280._M_dataplus._M_p._4_4_,local_280._M_dataplus._M_p._0_4_) !=
          &local_280.field_2) {
        operator_delete((undefined1 *)
                        CONCAT44(local_280._M_dataplus._M_p._4_4_,local_280._M_dataplus._M_p._0_4_),
                        local_280.field_2._M_allocated_capacity + 1);
      }
      uVar14 = 0;
      uVar10 = 0;
    }
    else {
      uVar14 = (ulong)*(uint *)((long)cVar9.
                                      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__khr_df_primaries_e>,_true>
                                      ._M_cur + 0x28);
      uVar10 = 0x100000000;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8._M_dataplus._M_p != paVar1) {
      operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238.first._M_dataplus._M_p != paVar12) {
      operator_delete(local_238.first._M_dataplus._M_p,
                      local_238.first.field_2._M_allocated_capacity + 1);
    }
    _Var11 = (_Optional_payload_base<_khr_df_primaries_e>)(uVar10 | uVar14);
  }
  return (optional<_khr_df_primaries_e>)_Var11;
}

Assistant:

std::optional<khr_df_primaries_e> parseColorPrimaries(cxxopts::ParseResult& args, const char* argName, Reporter& report) const {
        static const std::unordered_map<std::string, khr_df_primaries_e> values{
            { "NONE", KHR_DF_PRIMARIES_UNSPECIFIED },
            { "BT709", KHR_DF_PRIMARIES_BT709 },
            { "SRGB", KHR_DF_PRIMARIES_SRGB },
            { "BT601_EBU", KHR_DF_PRIMARIES_BT601_EBU },
            { "BT601_SMPTE", KHR_DF_PRIMARIES_BT601_SMPTE },
            { "BT2020", KHR_DF_PRIMARIES_BT2020 },
            { "CIEXYZ", KHR_DF_PRIMARIES_CIEXYZ },
            { "ACES", KHR_DF_PRIMARIES_ACES },
            { "ACESCC", KHR_DF_PRIMARIES_ACESCC },
            { "NTSC1953", KHR_DF_PRIMARIES_NTSC1953 },
            { "PAL525", KHR_DF_PRIMARIES_PAL525 },
            { "DISPLAYP3", KHR_DF_PRIMARIES_DISPLAYP3 },
            { "ADOBERGB", KHR_DF_PRIMARIES_ADOBERGB },
        };

        std::optional<khr_df_primaries_e> result = {};

        if (args[argName].count()) {
            auto primariesStr = to_upper_copy(args[argName].as<std::string>());
            const std::string prefixStr = "KHR_DF_PRIMARIES_";
            if (primariesStr.find(prefixStr) == 0) {
                primariesStr.erase(primariesStr.begin(),
                                   primariesStr.begin() + prefixStr.size());
            }
            const auto it = values.find(primariesStr);
            if (it != values.end()) {
                result = it->second;
            } else {
                report.fatal_usage("Invalid or unsupported primaries specified as --{} argument: \"{}\".", argName,
                                   args[argName].as<std::string>());
            }
        }

        return result;
    }